

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbinode.cpp
# Opt level: O0

RBBINode * __thiscall icu_63::RBBINode::flattenVariables(RBBINode *this)

{
  RBBINode *pRVar1;
  void *in_RSI;
  RBBINode *retNode;
  RBBINode *this_local;
  
  if (this->fType == varRef) {
    this_local = cloneTree(this->fLeftChild);
    if (this_local != (RBBINode *)0x0) {
      this_local->fRuleRoot = this->fRuleRoot;
      this_local->fChainIn = this->fChainIn;
    }
    if (this != (RBBINode *)0x0) {
      ~RBBINode(this);
      UMemory::operator_delete((UMemory *)this,in_RSI);
    }
  }
  else {
    if (this->fLeftChild != (RBBINode *)0x0) {
      pRVar1 = flattenVariables(this->fLeftChild);
      this->fLeftChild = pRVar1;
      this->fLeftChild->fParent = this;
    }
    this_local = this;
    if (this->fRightChild != (RBBINode *)0x0) {
      pRVar1 = flattenVariables(this->fRightChild);
      this->fRightChild = pRVar1;
      this->fRightChild->fParent = this;
    }
  }
  return this_local;
}

Assistant:

RBBINode *RBBINode::flattenVariables() {
    if (fType == varRef) {
        RBBINode *retNode  = fLeftChild->cloneTree();
        if (retNode != NULL) {
            retNode->fRuleRoot = this->fRuleRoot;
            retNode->fChainIn  = this->fChainIn;
        }
        delete this;   // TODO: undefined behavior. Fix.
        return retNode;
    }

    if (fLeftChild != NULL) {
        fLeftChild = fLeftChild->flattenVariables();
        fLeftChild->fParent  = this;
    }
    if (fRightChild != NULL) {
        fRightChild = fRightChild->flattenVariables();
        fRightChild->fParent = this;
    }
    return this;
}